

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,int n)

{
  ImGuiID id_00;
  uint *puVar1;
  ImGuiContext_conflict *g;
  ImGuiID id;
  ImGuiID seed;
  int n_local;
  ImGuiWindow_conflict *this_local;
  
  id = n;
  _seed = this;
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)&this->IDStack);
  id_00 = ImHashData(&id,4,*puVar1);
  ImGui::KeepAliveID(id_00);
  if (GImGui->DebugHookIdInfo == id_00) {
    ImGui::DebugHookIdInfo(id_00,4,(void *)(long)(int)id,(void *)0x0);
  }
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
    ImGui::KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
    return id;
}